

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createUndefinedConstant(Builder *this,Id type)

{
  Id IVar1;
  Instruction *this_00;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  Instruction *local_20;
  Instruction *inst;
  Builder *pBStack_10;
  Id type_local;
  Builder *this_local;
  
  inst._4_4_ = type;
  pBStack_10 = this;
  this_00 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,type));
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar1,inst._4_4_,OpUndef);
  local_20 = this_00;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,this_00)
  ;
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38);
  IVar1 = Instruction::getResultId(local_20);
  return IVar1;
}

Assistant:

Id Builder::createUndefinedConstant(Id type)
{
  Instruction* inst = new Instruction(getUniqueId(), type, OpUndef);
  constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
  return inst->getResultId();
}